

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vx-sound.c
# Opt level: O0

void VxSndInit(void)

{
  char cVar1;
  int iVar2;
  long lVar3;
  char *name;
  ALCcontext *context;
  long local_10;
  
  device = (ALCdevice *)alcOpenDevice(0);
  if (device == (ALCdevice *)0x0) {
    fprintf(_stderr,"Can\'t open audio device!\n");
    exit(1);
  }
  lVar3 = alcCreateContext(device,0);
  if (lVar3 == 0) {
LAB_00182aaf:
    if (lVar3 != 0) {
      alcDestroyContext(lVar3);
    }
    alcCloseDevice(device);
    fprintf(_stderr,"Could not set a context!\n");
    exit(1);
  }
  cVar1 = alcMakeContextCurrent(lVar3);
  if (cVar1 == '\0') goto LAB_00182aaf;
  local_10 = 0;
  cVar1 = alcIsExtensionPresent(device,"ALC_ENUMERATE_ALL_EXT");
  if (cVar1 != '\0') {
    local_10 = alcGetString(device,0x1013);
  }
  if (local_10 != 0) {
    iVar2 = alcGetError(device);
    if (iVar2 == 0) goto LAB_00182b54;
  }
  local_10 = alcGetString(device,0x1005);
LAB_00182b54:
  printf("Successfully initialized sound! Device name: %s\n",local_10);
  return;
}

Assistant:

void VxSndInit() {
    ALCcontext* context;
    device = alcOpenDevice(NULL);

    if (!device) {
        fprintf(stderr, "Can't open audio device!\n");
        exit(EXIT_FAILURE);
    }

    context = alcCreateContext(device, NULL);
    if (context == NULL || alcMakeContextCurrent(context) == ALC_FALSE) {
        if (context != NULL)
            alcDestroyContext(context);
        alcCloseDevice(device);
        fprintf(stderr, "Could not set a context!\n");
        exit(EXIT_FAILURE);
    }

    const char* name = NULL;
    if (alcIsExtensionPresent(device, "ALC_ENUMERATE_ALL_EXT"))
        name = alcGetString(device, ALC_ALL_DEVICES_SPECIFIER);
    if (!name || alcGetError(device) != AL_NO_ERROR)
        name = alcGetString(device, ALC_DEVICE_SPECIFIER);

    printf("Successfully initialized sound! Device name: %s\n", name);
}